

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase100::run(TestCase100 *this)

{
  int iVar1;
  _func_int **pp_Var2;
  int local_4c;
  Own<kj::ConstFunction<int_(int,_int)>::Iface> local_48;
  ConstFunction<int_(int,_int)> f;
  uint local_24;
  ConstFunction<unsigned_int_(unsigned_int,_unsigned_int)> f2;
  
  local_24 = 0;
  f.impl.ptr = (Iface *)operator_new(0x18);
  (f.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___00421920;
  f.impl.ptr[1]._vptr_Iface = (_func_int **)&local_24;
  f.impl.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::ConstFunction<int(int,int)>::Impl<kj::_::BoundMethod<kj::(anonymous_namespace)::TestConstType&,kj::(anonymous_namespace)::TestCase100::run()::$_0,kj::(anonymous_namespace)::TestCase100::run()::$_1>>>
        ::instance;
  f2.impl.ptr = (Iface *)operator_new(0x18);
  (f2.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___00421988;
  f2.impl.ptr[1]._vptr_Iface = (_func_int **)&local_24;
  f2.impl.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::ConstFunction<unsigned_int(unsigned_int,unsigned_int)>::Impl<kj::_::BoundMethod<kj::(anonymous_namespace)::TestConstType&,kj::(anonymous_namespace)::TestCase100::run()::$_2,kj::(anonymous_namespace)::TestCase100::run()::$_3>>>
        ::instance;
  local_24 = 3;
  local_48.ptr = (Iface *)operator_new(0x10);
  (local_48.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___004219f0;
  local_48.ptr[1]._vptr_Iface = (_func_int **)0xa;
  local_48.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::ConstFunction<int(int,int)>::Impl<kj::_::BoundMethod<kj::(anonymous_namespace)::TestConstType,kj::(anonymous_namespace)::TestCase100::run()::$_4,kj::(anonymous_namespace)::TestCase100::run()::$_5>>>
        ::instance;
  Own<kj::ConstFunction<int_(int,_int)>::Iface>::operator=(&f.impl,&local_48);
  Own<kj::ConstFunction<int_(int,_int)>::Iface>::dispose(&local_48);
  iVar1 = (**(f.impl.ptr)->_vptr_Iface)(f.impl.ptr,0x7b,0x1c8);
  if ((iVar1 != 0x24d) && (_::Debug::minSeverity < 3)) {
    local_48.disposer = (Disposer *)CONCAT44(local_48.disposer._4_4_,0x24d);
    local_4c = (**(f.impl.ptr)->_vptr_Iface)(f.impl.ptr,0x7b,0x1c8);
    _::Debug::log<char_const(&)[51],int,int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/function-test.c++"
               ,0x72,ERROR,
               "\"failed: expected \" \"(123 + 456 + 10) == (f(123, 456))\", 123 + 456 + 10, f(123, 456)"
               ,(char (*) [51])"failed: expected (123 + 456 + 10) == (f(123, 456))",(int *)&local_48
               ,&local_4c);
  }
  iVar1 = (**(f.impl.ptr)->_vptr_Iface)(f.impl.ptr,7,8);
  if ((iVar1 != 0x1a) && (_::Debug::minSeverity < 3)) {
    local_48.disposer = (Disposer *)CONCAT44(local_48.disposer._4_4_,0x1a);
    local_4c = (**(f.impl.ptr)->_vptr_Iface)(f.impl.ptr,7,8);
    _::Debug::log<char_const(&)[43],int,int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/function-test.c++"
               ,0x73,ERROR,
               "\"failed: expected \" \"(7 + 8 + 11) == (f(7, 8))\", 7 + 8 + 11, f(7, 8)",
               (char (*) [43])"failed: expected (7 + 8 + 11) == (f(7, 8))",(int *)&local_48,
               &local_4c);
  }
  iVar1 = (**(f.impl.ptr)->_vptr_Iface)(f.impl.ptr,2,9);
  if ((iVar1 != 0x17) && (_::Debug::minSeverity < 3)) {
    local_48.disposer = (Disposer *)CONCAT44(local_48.disposer._4_4_,0x17);
    local_4c = (**(f.impl.ptr)->_vptr_Iface)(f.impl.ptr,2,9);
    _::Debug::log<char_const(&)[43],int,int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/function-test.c++"
               ,0x74,ERROR,
               "\"failed: expected \" \"(9 + 2 + 12) == (f(2, 9))\", 9 + 2 + 12, f(2, 9)",
               (char (*) [43])"failed: expected (9 + 2 + 12) == (f(2, 9))",(int *)&local_48,
               &local_4c);
  }
  pp_Var2 = (_func_int **)(ulong)local_24;
  local_48.ptr = (Iface *)operator_new(0x10);
  (local_48.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___00421a58;
  local_48.ptr[1]._vptr_Iface = pp_Var2;
  local_48.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::ConstFunction<int(int,int)>::Impl<kj::_::BoundMethod<kj::(anonymous_namespace)::TestConstType,kj::(anonymous_namespace)::TestCase100::run()::$_6,kj::(anonymous_namespace)::TestCase100::run()::$_7>>>
        ::instance;
  Own<kj::ConstFunction<int_(int,_int)>::Iface>::operator=(&f.impl,&local_48);
  Own<kj::ConstFunction<int_(int,_int)>::Iface>::dispose(&local_48);
  local_24 = 0x4d2;
  iVar1 = (**(f.impl.ptr)->_vptr_Iface)(f.impl.ptr,0x7b,0x1c8);
  if ((iVar1 != 0x246) && (_::Debug::minSeverity < 3)) {
    local_48.disposer = (Disposer *)CONCAT44(local_48.disposer._4_4_,0x246);
    local_4c = (**(f.impl.ptr)->_vptr_Iface)(f.impl.ptr,0x7b,0x1c8);
    _::Debug::log<char_const(&)[50],int,int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/function-test.c++"
               ,0x7a,ERROR,
               "\"failed: expected \" \"(123 + 456 + 3) == (f(123, 456))\", 123 + 456 + 3, f(123, 456)"
               ,(char (*) [50])"failed: expected (123 + 456 + 3) == (f(123, 456))",(int *)&local_48,
               &local_4c);
  }
  iVar1 = (**(f.impl.ptr)->_vptr_Iface)(f.impl.ptr,7,8);
  if ((iVar1 != 0x13) && (_::Debug::minSeverity < 3)) {
    local_48.disposer = (Disposer *)CONCAT44(local_48.disposer._4_4_,0x13);
    local_4c = (**(f.impl.ptr)->_vptr_Iface)(f.impl.ptr,7,8);
    _::Debug::log<char_const(&)[42],int,int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/function-test.c++"
               ,0x7b,ERROR,"\"failed: expected \" \"(7 + 8 + 4) == (f(7, 8))\", 7 + 8 + 4, f(7, 8)",
               (char (*) [42])"failed: expected (7 + 8 + 4) == (f(7, 8))",(int *)&local_48,&local_4c
              );
  }
  iVar1 = (**(f.impl.ptr)->_vptr_Iface)(f.impl.ptr,2,9);
  if ((iVar1 != 0x10) && (_::Debug::minSeverity < 3)) {
    local_48.disposer = (Disposer *)CONCAT44(local_48.disposer._4_4_,0x10);
    local_4c = (**(f.impl.ptr)->_vptr_Iface)(f.impl.ptr,2,9);
    _::Debug::log<char_const(&)[42],int,int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/function-test.c++"
               ,0x7c,ERROR,"\"failed: expected \" \"(9 + 2 + 5) == (f(2, 9))\", 9 + 2 + 5, f(2, 9)",
               (char (*) [42])"failed: expected (9 + 2 + 5) == (f(2, 9))",(int *)&local_48,&local_4c
              );
  }
  Own<kj::ConstFunction<unsigned_int_(unsigned_int,_unsigned_int)>::Iface>::dispose(&f2.impl);
  Own<kj::ConstFunction<int_(int,_int)>::Iface>::dispose(&f.impl);
  return;
}

Assistant:

TEST(ConstFunction, Method) {
  TestConstType obj;
  ConstFunction<int(int, int)> f = KJ_BIND_METHOD(obj, foo);
  ConstFunction<uint(uint, uint)> f2 = KJ_BIND_METHOD(obj, foo);

  EXPECT_EQ(123 + 456, f(123, 456));
  EXPECT_EQ(7 + 8 + 1, f(7, 8));
  EXPECT_EQ(9u + 2u + 2u, f2(2, 9));

  EXPECT_EQ(3, obj.callCount);

  // Bind to a temporary.
  f = KJ_BIND_METHOD(TestConstType(10), foo);

  EXPECT_EQ(123 + 456 + 10, f(123, 456));
  EXPECT_EQ(7 + 8 + 11, f(7, 8));
  EXPECT_EQ(9 + 2 + 12, f(2, 9));

  // Bind to a move.
  f = KJ_BIND_METHOD(kj::mv(obj), foo);
  obj.callCount = 1234;

  EXPECT_EQ(123 + 456 + 3, f(123, 456));
  EXPECT_EQ(7 + 8 + 4, f(7, 8));
  EXPECT_EQ(9 + 2 + 5, f(2, 9));
}